

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O3

void __thiscall wasm::InstrumentMemory::visitStructSet(InstrumentMemory *this,StructSet *curr)

{
  Index x;
  uintptr_t uVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  Expression *pEVar4;
  MixedArena *this_00;
  initializer_list<wasm::Expression_*> __l;
  Const *local_70;
  Expression *local_68;
  Builder local_60;
  Builder builder;
  pointer local_48;
  allocator_type local_31;
  
  local_60.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  uVar1 = (curr->value->type).id;
  if (uVar1 - 2 < 4) {
    uVar2 = *(undefined8 *)(&PTR_DAT_00d741a8)[uVar1];
    uVar1 = *(uintptr_t *)(&PTR_struct_get_val_f32_00d74188)[uVar1];
    x = this->id;
    this->id = x + 1;
    local_70 = Builder::makeConst<int>(&local_60,x);
    local_68 = curr->value;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_70;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,__l,
               &local_31);
    uVar3 = (curr->value->type).id;
    this_00 = &(local_60.wasm)->allocator;
    pEVar4 = (Expression *)MixedArena::allocSpace(this_00,0x48,8);
    pEVar4->_id = CallId;
    *(undefined8 *)(pEVar4 + 1) = 0;
    pEVar4[1].type.id = 0;
    *(undefined8 *)(pEVar4 + 2) = 0;
    pEVar4[2].type.id = (uintptr_t)this_00;
    *(undefined1 *)&pEVar4[4]._id = InvalidId;
    (pEVar4->type).id = uVar3;
    *(undefined8 *)(pEVar4 + 3) = uVar2;
    pEVar4[3].type.id = uVar1;
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar4 + 1),
               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
    *(undefined1 *)&pEVar4[4]._id = InvalidId;
    curr->value = pEVar4;
    if (builder.wasm != (Module *)0x0) {
      operator_delete(builder.wasm,(long)local_48 - (long)builder.wasm);
    }
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
    Builder builder(*getModule());
    Name target;
    if (curr->value->type == Type::i32) {
      target = struct_set_val_i32;
    } else if (curr->value->type == Type::i64) {
      target = struct_set_val_i64;
    } else if (curr->value->type == Type::f32) {
      target = struct_set_val_f32;
    } else if (curr->value->type == Type::f64) {
      target = struct_set_val_f64;
    } else {
      return; // TODO: other types, unreachable, etc.
    }
    curr->value =
      builder.makeCall(target,
                       {builder.makeConst(int32_t(id++)), curr->value},
                       curr->value->type);
  }